

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O1

vec3 __thiscall rengine::mat4::operator*(mat4 *this,vec3 v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  vec3 vVar4;
  
  fVar3 = v.z;
  fVar1 = v.x;
  fVar2 = v.y;
  vVar4.z = fVar3 * this->m[10] + this->m[8] * fVar1 + fVar2 * this->m[9] + this->m[0xb];
  vVar4.y = this->m[6] * fVar3 + this->m[4] * fVar1 + this->m[5] * fVar2 + this->m[7];
  vVar4.x = this->m[2] * fVar3 + this->m[0] * fVar1 + this->m[1] * fVar2 + this->m[3];
  return vVar4;
}

Assistant:

vec3 operator*(vec3 v) const {
        return vec3(m[0] * v.x + m[1] * v.y + m[ 2] * v.z + m[ 3],
                    m[4] * v.x + m[5] * v.y + m[ 6] * v.z + m[ 7],
                    m[8] * v.x + m[9] * v.y + m[10] * v.z + m[11]);
    }